

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

bool __thiscall cmCustomCommandGenerator::HasOnlyEmptyCommandLines(cmCustomCommandGenerator *this)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  ulong uVar3;
  ulong local_28;
  size_t j;
  size_t i;
  cmCustomCommandGenerator *this_local;
  
  j = 0;
  do {
    sVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::size
                      (&(this->CommandLines).
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if (sVar1 <= j) {
      return true;
    }
    local_28 = 0;
    while( true ) {
      pvVar2 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                          (&(this->CommandLines).
                            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                           j)->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar2);
      if (sVar1 <= local_28) break;
      pvVar2 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                          (&(this->CommandLines).
                            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                           j)->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar2,local_28);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        return false;
      }
      local_28 = local_28 + 1;
    }
    j = j + 1;
  } while( true );
}

Assistant:

bool cmCustomCommandGenerator::HasOnlyEmptyCommandLines() const
{
  for (size_t i = 0; i < this->CommandLines.size(); ++i) {
    for (size_t j = 0; j < this->CommandLines[i].size(); ++j) {
      if (!this->CommandLines[i][j].empty()) {
        return false;
      }
    }
  }
  return true;
}